

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib586.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  char *local_60;
  userdata user;
  CURL *pCStack_48;
  int i;
  CURLSH *share;
  CURL *curl;
  Tdata tdata;
  char *url;
  CURLSHcode scode;
  int res;
  char *URL_local;
  
  local_60 = "Pigs in space";
  user.text._0_4_ = 0;
  curl_mprintf("GLOBAL_INIT\n");
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    curl_mprintf("SHARE_INIT\n");
    pCStack_48 = (CURL *)curl_share_init();
    if (pCStack_48 == (CURL *)0x0) {
      curl_mfprintf(_stderr,"curl_share_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      curl_mprintf("CURLSHOPT_LOCKFUNC\n");
      url._0_4_ = curl_share_setopt(pCStack_48,3,my_lock);
      if ((int)url == 0) {
        curl_mprintf("CURLSHOPT_UNLOCKFUNC\n");
        url._0_4_ = curl_share_setopt(pCStack_48,4,my_unlock);
      }
      if ((int)url == 0) {
        curl_mprintf("CURLSHOPT_USERDATA\n");
        url._0_4_ = curl_share_setopt(pCStack_48,5,&local_60);
      }
      if ((int)url == 0) {
        curl_mprintf("CURL_LOCK_DATA_SSL_SESSION\n");
        url._0_4_ = curl_share_setopt(pCStack_48,1,4);
      }
      if ((int)url == 0) {
        for (user._12_4_ = 1; (int)user._12_4_ < 3; user._12_4_ = user._12_4_ + 1) {
          curl = pCStack_48;
          tdata.share = (CURLSH *)URL;
          curl_mprintf("*** run %d\n",user._12_4_);
          fire(&curl);
        }
        curl_mprintf("*** run %d\n",user._12_4_);
        lVar2 = curl_easy_init();
        if (lVar2 == 0) {
          curl_mfprintf(_stderr,"curl_easy_init() failed\n");
          curl_share_cleanup(pCStack_48);
          curl_global_cleanup();
          URL_local._4_4_ = 0x7e;
        }
        else {
          tdata.url = URL;
          url._4_4_ = curl_easy_setopt(lVar2,0x2712,URL);
          if (url._4_4_ == 0) {
            curl_mprintf("CURLOPT_SHARE\n");
            url._4_4_ = curl_easy_setopt(lVar2,0x2774,pCStack_48);
            if (url._4_4_ == 0) {
              curl_mprintf("PERFORM\n");
              curl_easy_perform(lVar2);
              curl_mprintf("try SHARE_CLEANUP...\n");
              iVar1 = curl_share_cleanup(pCStack_48);
              if (iVar1 == 0) {
                curl_mfprintf(_stderr,"curl_share_cleanup succeed but error expected\n");
                pCStack_48 = (CURL *)0x0;
              }
              else {
                curl_mprintf("SHARE_CLEANUP failed, correct\n");
              }
            }
          }
          curl_mprintf("CLEANUP\n");
          curl_easy_cleanup(lVar2);
          curl_mprintf("SHARE_CLEANUP\n");
          iVar1 = curl_share_cleanup(pCStack_48);
          if (iVar1 != 0) {
            curl_mfprintf(_stderr,"curl_share_cleanup failed, code errno %d\n",iVar1);
          }
          curl_mprintf("GLOBAL_CLEANUP\n");
          curl_global_cleanup();
          URL_local._4_4_ = url._4_4_;
        }
      }
      else {
        curl_mfprintf(_stderr,"curl_share_setopt() failed\n");
        curl_share_cleanup(pCStack_48);
        curl_global_cleanup();
        URL_local._4_4_ = 0x7e;
      }
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res;
  CURLSHcode scode = CURLSHE_OK;
  char *url;
  struct Tdata tdata;
  CURL *curl;
  CURLSH *share;
  int i;
  struct userdata user;

  user.text = "Pigs in space";
  user.counter = 0;

  printf("GLOBAL_INIT\n");
  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  /* prepare share */
  printf("SHARE_INIT\n");
  share = curl_share_init();
  if(!share) {
    fprintf(stderr, "curl_share_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  if(CURLSHE_OK == scode) {
    printf("CURLSHOPT_LOCKFUNC\n");
    scode = curl_share_setopt(share, CURLSHOPT_LOCKFUNC, my_lock);
  }
  if(CURLSHE_OK == scode) {
    printf("CURLSHOPT_UNLOCKFUNC\n");
    scode = curl_share_setopt(share, CURLSHOPT_UNLOCKFUNC, my_unlock);
  }
  if(CURLSHE_OK == scode) {
    printf("CURLSHOPT_USERDATA\n");
    scode = curl_share_setopt(share, CURLSHOPT_USERDATA, &user);
  }
  if(CURLSHE_OK == scode) {
    printf("CURL_LOCK_DATA_SSL_SESSION\n");
    scode = curl_share_setopt(share, CURLSHOPT_SHARE,
                              CURL_LOCK_DATA_SSL_SESSION);
  }

  if(CURLSHE_OK != scode) {
    fprintf(stderr, "curl_share_setopt() failed\n");
    curl_share_cleanup(share);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }


  res = 0;

  /* start treads */
  for(i = 1; i <= THREADS; i++) {

    /* set thread data */
    tdata.url   = URL;
    tdata.share = share;

    /* simulate thread, direct call of "thread" function */
    printf("*** run %d\n",i);
    fire(&tdata);
  }


  /* fetch a another one */
  printf("*** run %d\n", i);
  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_share_cleanup(share);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  url = URL;
  test_setopt(curl, CURLOPT_URL, url);
  printf("CURLOPT_SHARE\n");
  test_setopt(curl, CURLOPT_SHARE, share);

  printf("PERFORM\n");
  curl_easy_perform(curl);

  /* try to free share, expect to fail because share is in use*/
  printf("try SHARE_CLEANUP...\n");
  scode = curl_share_cleanup(share);
  if(scode == CURLSHE_OK) {
    fprintf(stderr, "curl_share_cleanup succeed but error expected\n");
    share = NULL;
  }
  else {
    printf("SHARE_CLEANUP failed, correct\n");
  }

test_cleanup:

  /* clean up last handle */
  printf("CLEANUP\n");
  curl_easy_cleanup(curl);

  /* free share */
  printf("SHARE_CLEANUP\n");
  scode = curl_share_cleanup(share);
  if(scode != CURLSHE_OK)
    fprintf(stderr, "curl_share_cleanup failed, code errno %d\n",
            (int)scode);

  printf("GLOBAL_CLEANUP\n");
  curl_global_cleanup();

  return res;
}